

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::StructPackingPass::findStructIdByName(StructPackingPass *this,char *structName)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *this_00;
  Operand *pOVar4;
  bool local_72;
  string local_70;
  Instruction *local_50;
  Instruction *instr;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  char *structName_local;
  StructPackingPass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  IRContext::module(this_00);
  Module::debugs2((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&instr);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&instr);
    if (!bVar1) {
      return 0;
    }
    local_50 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = Instruction::opcode(local_50);
    local_72 = false;
    if (OVar2 == OpName) {
      pOVar4 = Instruction::GetOperand(local_50,1);
      Operand::AsString_abi_cxx11_(&local_70,pOVar4);
      local_72 = std::operator==(&local_70,structName);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (local_72 != false) break;
    InstructionList::iterator::operator++(&__end2);
  }
  pOVar4 = Instruction::GetOperand(local_50,0);
  uVar3 = Operand::AsId(pOVar4);
  return uVar3;
}

Assistant:

uint32_t StructPackingPass::findStructIdByName(const char* structName) const {
  for (Instruction& instr : context()->module()->debugs2()) {
    if (instr.opcode() == spv::Op::OpName &&
        instr.GetOperand(1).AsString() == structName) {
      return instr.GetOperand(0).AsId();
    }
  }
  return 0;
}